

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XInclude.cpp
# Opt level: O0

int main(int argC,char **argV)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  long *plVar6;
  ulong uVar7;
  ostream *poVar8;
  long lVar9;
  long *plVar10;
  LocalFileFormatTarget *this;
  code *pcVar11;
  long local_21a8;
  XMLException *toCatch_3;
  XMLCh errText_1 [2048];
  uint maxChars_1;
  DOMException *toCatch_4;
  XMLFormatTarget *myFormTarget;
  DOMLSOutput *theOutputDesc;
  DOMLSSerializer *writer;
  XMLException *toCatch_1;
  XMLCh errText [2048];
  uint maxChars;
  DOMException *toCatch_2;
  DOMDocument *doc;
  XIncludeErrorHandler errorHandler;
  DOMConfiguration *config;
  DOMLSParser *parser;
  DOMImplementation *impl;
  XMLException *toCatch;
  int local_2c;
  int argInd;
  char *outputFileName;
  char *testFileName;
  char **argV_local;
  int argC_local;
  
  local_2c = 1;
  while( true ) {
    if (argC <= local_2c) {
      if (argC < 3) {
        usage();
        argV_local._4_4_ = 2;
      }
      else {
        pcVar1 = argV[argC + -2];
        pcVar2 = argV[argC + -1];
        xercesc_4_0::XMLPlatformUtils::Initialize
                  ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,
                   (PanicHandler *)0x0,(MemoryManager *)0x0);
        plVar5 = (long *)xercesc_4_0::DOMImplementationRegistry::getDOMImplementation(L"LS");
        plVar6 = (long *)(**(code **)(*plVar5 + 0x10))
                                   (plVar5,1,0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        errorHandler._8_8_ = (**(code **)(*plVar6 + 0x10))();
        (**(code **)(*(long *)errorHandler._8_8_ + 8))
                  (errorHandler._8_8_,&xercesc_4_0::XMLUni::fgDOMNamespaces,1);
        (**(code **)(*(long *)errorHandler._8_8_ + 8))
                  (errorHandler._8_8_,&xercesc_4_0::XMLUni::fgXercesSchema,1);
        (**(code **)(*(long *)errorHandler._8_8_ + 8))
                  (errorHandler._8_8_,&xercesc_4_0::XMLUni::fgXercesHandleMultipleImports,1);
        (**(code **)(*(long *)errorHandler._8_8_ + 8))
                  (errorHandler._8_8_,&xercesc_4_0::XMLUni::fgXercesSchemaFullChecking,1);
        uVar7 = (**(code **)(*(long *)errorHandler._8_8_ + 0x20))
                          (errorHandler._8_8_,&xercesc_4_0::XMLUni::fgXercesDoXInclude,1);
        if ((uVar7 & 1) != 0) {
          (**(code **)(*(long *)errorHandler._8_8_ + 8))
                    (errorHandler._8_8_,&xercesc_4_0::XMLUni::fgXercesDoXInclude,1);
        }
        XIncludeErrorHandler::XIncludeErrorHandler((XIncludeErrorHandler *)&doc);
        (*(code *)**(undefined8 **)errorHandler._8_8_)
                  (errorHandler._8_8_,&xercesc_4_0::XMLUni::fgDOMErrorHandler,
                   (XIncludeErrorHandler *)&doc);
        poVar8 = std::operator<<((ostream *)&std::cerr,"Parse ");
        poVar8 = std::operator<<(poVar8,pcVar1);
        std::operator<<(poVar8," in progress ...");
        (**(code **)(*plVar6 + 0x68))();
        lVar9 = (**(code **)(*plVar6 + 0x48))(plVar6,pcVar1);
        poVar8 = std::operator<<((ostream *)&std::cerr," finished.");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        bVar3 = XIncludeErrorHandler::getSawErrors((XIncludeErrorHandler *)&doc);
        if ((!bVar3) && (lVar9 != 0)) {
          plVar10 = (long *)(**(code **)(*plVar5 + 0x18))
                                      (plVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          plVar5 = (long *)(**(code **)(*plVar5 + 0x28))
                                     (plVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          poVar8 = std::operator<<((ostream *)&std::cerr,"Writing result to: ");
          poVar8 = std::operator<<(poVar8,pcVar2);
          pcVar11 = std::endl<char,std::char_traits<char>>;
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          this = (LocalFileFormatTarget *)
                 xercesc_4_0::XMemory::operator_new((XMemory *)0x30,(ulong)pcVar11);
          xercesc_4_0::LocalFileFormatTarget::LocalFileFormatTarget
                    (this,pcVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          (**(code **)(*plVar5 + 0x28))(plVar5,this);
          local_21a8 = 0;
          if (lVar9 != 0) {
            local_21a8 = lVar9 + 0x18;
          }
          (**(code **)(*plVar10 + 0x38))(plVar10,local_21a8,plVar5);
          if (this != (LocalFileFormatTarget *)0x0) {
            (**(code **)(*(long *)this + 8))();
          }
          (**(code **)(*plVar10 + 0x50))();
          (**(code **)(*plVar5 + 0x40))();
        }
        (**(code **)(*plVar6 + 0x60))();
        xercesc_4_0::XMLPlatformUtils::Terminate();
        argV_local._4_4_ = 0;
        XIncludeErrorHandler::~XIncludeErrorHandler((XIncludeErrorHandler *)&doc);
      }
      return argV_local._4_4_;
    }
    iVar4 = strcmp(argV[local_2c],"-?");
    if ((iVar4 == 0) || (iVar4 = strcmp(argV[local_2c],"-h"), iVar4 == 0)) break;
    local_2c = local_2c + 1;
  }
  usage();
  return 2;
}

Assistant:

int main(int argC, char* argV[])
{
	char						*testFileName;
	char						*outputFileName;

    for (int argInd = 1; argInd < argC; argInd++)
	{
        if (!strcmp(argV[argInd], "-?") || !strcmp(argV[argInd], "-h"))
        {
			/* print help and exit */
            usage();
            return 2;
        }
    }

	if (argC < 3){
		usage();
		return 2;
	}

	testFileName = argV[argC-2];
	outputFileName = argV[argC-1];

    // Initialize the XML4C system
    try
    {
        XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
         std::cerr << "Error during initialization! :\n"
              << StrX(toCatch.getMessage()) << std::endl;
         return 1;
    }

	//============================================================================
	// Instantiate the DOM parser to use for the source documents
	//============================================================================
    static const XMLCh gLS[] = { chLatin_L, chLatin_S, chNull };
    DOMImplementation *impl = DOMImplementationRegistry::getDOMImplementation(gLS);
    DOMLSParser       *parser = ((DOMImplementationLS*)impl)->createLSParser(DOMImplementationLS::MODE_SYNCHRONOUS, 0);
    DOMConfiguration  *config = parser->getDomConfig();

    config->setParameter(XMLUni::fgDOMNamespaces, true);
    config->setParameter(XMLUni::fgXercesSchema, true);
    config->setParameter(XMLUni::fgXercesHandleMultipleImports, true);
    config->setParameter(XMLUni::fgXercesSchemaFullChecking, true);

    if(config->canSetParameter(XMLUni::fgXercesDoXInclude, true)){
      config->setParameter(XMLUni::fgXercesDoXInclude, true);
    }

    // enable datatype normalization - default is off
    //config->setParameter(XMLUni::fgDOMDatatypeNormalization, true);

    // And create our error handler and install it
    XIncludeErrorHandler errorHandler;
    config->setParameter(XMLUni::fgDOMErrorHandler, &errorHandler);

    xercesc::DOMDocument *doc = 0;

    try
    {
        // load up the test source document
		std::cerr << "Parse " << testFileName << " in progress ...";
        parser->resetDocumentPool();
		doc = parser->parseURI(testFileName);
		std::cerr << " finished." << std::endl;
    }
    catch (const XMLException& toCatch)
    {
        std::cerr << "\nError during parsing: '" << testFileName << "'\n"
                << "Exception message is:  \n"
                << StrX(toCatch.getMessage()) << "\n" << std::endl;
    }
    catch (const DOMException& toCatch)
    {
        const unsigned int maxChars = 2047;
        XMLCh errText[maxChars + 1];

        std::cerr << "\nDOM Error during parsing: '" << testFileName << "'\n"
                << "DOMException code is:  " << toCatch.code << std::endl;

        if (DOMImplementation::loadDOMExceptionMsg(toCatch.code, errText, maxChars))
                std::cerr << "Message is: " << StrX(errText) << std::endl;

    }
    catch (...)
    {
        std::cerr << "\nUnexpected exception during parsing: '" << testFileName << "'\n";
    }

    if (!errorHandler.getSawErrors() && doc) {
	    DOMLSSerializer	*writer = ((DOMImplementationLS*)impl)->createLSSerializer();
	    DOMLSOutput     *theOutputDesc = ((DOMImplementationLS*)impl)->createLSOutput();

		try {
			// write out the results
			std::cerr << "Writing result to: " << outputFileName << std::endl;

			XMLFormatTarget *myFormTarget = new LocalFileFormatTarget(outputFileName);
			theOutputDesc->setByteStream(myFormTarget);
			writer->write(doc, theOutputDesc);
            delete myFormTarget;
		}
		catch (const XMLException& toCatch)
		{
		    std::cerr << "\nXMLException during writing: '" << testFileName << "'\n"
				<< "Exception message is:  \n"
				<< StrX(toCatch.getMessage()) << "\n" << std::endl;
		}
		catch (const DOMException& toCatch)
		{
			const unsigned int maxChars = 2047;
			XMLCh errText[maxChars + 1];

			std::cerr << "\nDOM Error during writing: '" << testFileName << "'\n"
				<< "DOMException code is:  " << toCatch.code << std::endl;

			if (DOMImplementation::loadDOMExceptionMsg(toCatch.code, errText, maxChars))
				std::cerr << "Message is: " << StrX(errText) << std::endl;
		}
		catch (...)
		{
			std::cerr << "\nUnexpected exception during writing: '" << testFileName << "'\n";
		}
        writer->release();
        theOutputDesc->release();
    }

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    parser->release();
	// And call the termination method
    XMLPlatformUtils::Terminate();

    return 0;
}